

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzdecomp.cpp
# Opt level: O2

void __thiscall lzham::lzham_decompressor::reset_arith_tables(lzham_decompressor *this)

{
  uint i;
  long lVar1;
  
  for (lVar1 = 0; lVar1 != 0xc; lVar1 = lVar1 + 1) {
    this->m_is_match_model[lVar1].m_bit_0_prob = 0x400;
  }
  for (lVar1 = -0x18; lVar1 != 0; lVar1 = lVar1 + 2) {
    *(undefined2 *)((long)&this->m_is_rep0_model[0].m_bit_0_prob + lVar1) = 0x400;
    *(undefined2 *)((long)&this->m_is_rep0_single_byte_model[0].m_bit_0_prob + lVar1) = 0x400;
    *(undefined2 *)((long)&this->m_is_rep1_model[0].m_bit_0_prob + lVar1) = 0x400;
    *(undefined2 *)((long)&this->m_is_rep2_model[0].m_bit_0_prob + lVar1) = 0x400;
    *(undefined2 *)((long)(this->m_is_rep2_model + 0xc) + lVar1) = 0x400;
  }
  return;
}

Assistant:

void lzham_decompressor::reset_arith_tables()
   {
      for (uint i = 0; i < LZHAM_ARRAY_SIZE(m_is_match_model); i++)
         m_is_match_model[i].clear();

      for (uint i = 0; i < CLZDecompBase::cNumStates; i++)
      {
         m_is_rep_model[i].clear();
         m_is_rep0_model[i].clear();
         m_is_rep0_single_byte_model[i].clear();
         m_is_rep1_model[i].clear();
         m_is_rep2_model[i].clear();
      }
   }